

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O3

void Test28(void)

{
  CMReturn In;
  CMReturn res;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  ConfusableMatcher matcher;
  string local_2108;
  string local_20e8;
  undefined1 local_20c8;
  undefined7 uStack_20c7;
  undefined1 uStack_20c0;
  undefined7 uStack_20bf;
  undefined1 uStack_20b8;
  undefined7 uStack_20b7;
  undefined8 uStack_20b0;
  undefined8 local_20a8;
  undefined8 uStack_20a0;
  pointer in_stack_ffffffffffffdf68;
  pointer in_stack_ffffffffffffdf70;
  CMReturn local_2080;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2068;
  __node_base_ptr *pp_Var1;
  size_type sVar2;
  __node_base _Var3;
  __node_base_ptr p_Stack_2020;
  ConfusableMatcher local_2018;
  
  GetDefaultMap_abi_cxx11_();
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&stack0xffffffffffffdf68,&local_2068);
  pp_Var1 = &p_Stack_2020;
  sVar2 = 1;
  _Var3._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_2020 = (__node_base_ptr)0x0;
  ConfusableMatcher::ConfusableMatcher
            (&local_2018,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&stack0xffffffffffffdf68,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xffffffffffffdfb0,true);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&stack0xffffffffffffdfb0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&stack0xffffffffffffdf68);
  local_20e8._M_dataplus._M_p = (pointer)&local_20e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_20e8,"N|\\|NC","");
  local_2108._M_dataplus._M_p = (pointer)&local_2108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2108,"N","");
  local_20c8 = 1;
  uStack_20c7 = 0;
  uStack_20c0 = 0;
  uStack_20bf = 0;
  uStack_20b8 = 0;
  uStack_20b7 = 0;
  uStack_20b0 = 1000000;
  local_20a8 = 0;
  uStack_20a0 = 0;
  ConfusableMatcher::IndexOf
            (&local_2080,&local_2018,&local_20e8,&local_2108,
             (CMOptions)ZEXT3248(CONCAT824(1000000,CONCAT816(0,ZEXT816(1)))));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2108._M_dataplus._M_p != &local_2108.field_2) {
    operator_delete(local_2108._M_dataplus._M_p,local_2108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_20e8._M_dataplus._M_p != &local_20e8.field_2) {
    operator_delete(local_20e8._M_dataplus._M_p,local_20e8.field_2._M_allocated_capacity + 1);
  }
  In.Size = sVar2;
  In.Start = (uint64_t)pp_Var1;
  In._16_8_ = _Var3._M_nxt;
  AssertMatch(In,(size_t)in_stack_ffffffffffffdf70,(size_t)in_stack_ffffffffffffdf68);
  ConfusableMatcher::~ConfusableMatcher(&local_2018);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2068);
  return;
}

Assistant:

void Test28()
{
	auto map = GetDefaultMap();

	CMOptions opts = { };
	opts.TimeoutNs = 1000000;
	opts.MatchRepeating = true;
	auto matcher = ConfusableMatcher(map, {});
	auto res = matcher.IndexOf("N|\\|NC", "N", opts);
	AssertMatch(res, 0, 5);
}